

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

iteration_time __thiscall
helics::FederateState::requestTime
          (FederateState *this,Time nextTime,IterationRequest iterate,bool sendRequest)

{
  __atomic_flag_data_type _Var1;
  TimeCoordinator *pTVar2;
  long lVar3;
  pointer pIVar4;
  MessageTimer *pMVar5;
  long lVar6;
  long lVar7;
  _Alloc_hider _Var8;
  size_type sVar9;
  MessageProcessingResult result;
  int32_t iVar10;
  int iVar11;
  Time TVar12;
  duration dVar13;
  undefined7 extraout_var;
  long lVar14;
  int *piVar15;
  undefined7 in_register_00000009;
  ulong uVar16;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ActionMessage *this_00;
  bool sendRequest_00;
  ulong uVar17;
  time_type expirationTime;
  iteration_time iVar18;
  string_view logMessageSource;
  string_view logMessageSource_00;
  string_view logMessageSource_01;
  string_view fmt;
  string_view logMessageSource_02;
  string_view message;
  string_view message_00;
  string_view message_01;
  format_args args;
  string_view message_02;
  ActionMessage treq;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_3e8;
  size_t local_3e0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_3d8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_3c8;
  ulong local_3c0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_3b8;
  baseType local_3a8;
  ActionMessage local_310;
  ActionMessage local_258;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  uVar17 = CONCAT71(in_register_00000009,sendRequest) & 0xffffffff;
  LOCK();
  _Var1 = (this->processing).super___atomic_flag_base._M_i;
  (this->processing).super___atomic_flag_base._M_i = true;
  UNLOCK();
  sendRequest_00 = SUB81(uVar17,0);
  if (_Var1 != false) {
    if ((((this->queueProcessing)._M_base._M_i & 1U) == 0) &&
       (sched_yield(), ((this->queueProcessing)._M_base._M_i & 1U) == 0)) {
      iVar18 = requestTime(this,nextTime,iterate,sendRequest_00);
      TVar12 = iVar18.grantedTime.internalTimeCode;
      uVar17 = (ulong)iVar18._8_4_;
    }
    else {
      logMessageSource._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      logMessageSource._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      message._M_str = "duplicate locking attempted";
      message._M_len = 0x1b;
      logMessage(this,3,logMessageSource,message,false);
      sleeplock(this);
      uVar17 = CONCAT71((int7)(uVar17 >> 8),3);
      if ((this->state)._M_i != FINISHED) {
        uVar17 = 7;
        if ((this->state)._M_i != ERRORED) {
          uVar17 = (ulong)(byte)(this->iterating * '\x02');
        }
      }
      TVar12.internalTimeCode = (this->time_granted).internalTimeCode;
      LOCK();
      (this->processing).super___atomic_flag_base._M_i = false;
      UNLOCK();
    }
    goto LAB_0032e2d2;
  }
  pTVar2 = (this->timeCoord)._M_t.
           super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
           .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
  lVar3 = (pTVar2->time_granted).internalTimeCode;
  pIVar4 = (this->events).
           super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->events).
      super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
      super__Vector_impl_data._M_finish != pIVar4) {
    (this->events).
    super__Vector_base<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pIVar4;
  }
  sVar9 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var8._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if (0x17 < this->maxLogLevel) {
    (**(code **)((long)(pTVar2->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x58))
              (&local_3c8);
    logMessageSource_00._M_str = _Var8._M_p;
    logMessageSource_00._M_len = sVar9;
    message_00._M_str = (char *)local_3c8.values_;
    message_00._M_len = local_3c0;
    in_R9 = local_3c8;
    logMessage(this,0x18,logMessageSource_00,message_00,false);
    if (&(local_3c8.values_)->field_0 != &local_3b8) {
      operator_delete(local_3c8.values_,local_3b8.long_long_value + 1);
    }
  }
  if (sendRequest_00 != false) {
    ActionMessage::ActionMessage((ActionMessage *)&local_3c8,cmd_time_request);
    local_3c0 = CONCAT44(local_3c0._4_4_,(this->global_id)._M_i.gid);
    local_3a8 = nextTime.internalTimeCode;
    setIterationFlags((ActionMessage *)&local_3c8,iterate);
    local_3b8.uint128_value._10_1_ = local_3b8.uint128_value._10_1_ | 0x20;
    addAction(this,(ActionMessage *)&local_3c8);
    sVar9 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var8 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (0x17 < this->maxLogLevel) {
      (**(code **)((long)(((this->timeCoord)._M_t.
                           super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                           .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl)->
                         super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x58))(&local_3e8);
      logMessageSource_01._M_str = _Var8._M_p;
      logMessageSource_01._M_len = sVar9;
      message_01._M_str = (char *)local_3e8.values_;
      message_01._M_len = local_3e0;
      in_R9 = local_3e8;
      logMessage(this,0x18,logMessageSource_01,message_01,false);
      if (&(local_3e8.values_)->field_0 != &local_3d8) {
        operator_delete(local_3e8.values_,(ulong)(local_3d8.long_long_value + 1));
      }
    }
    ActionMessage::~ActionMessage((ActionMessage *)&local_3c8);
  }
  if ((this->realtime == true) && ((this->rt_lag).internalTimeCode != 0x7fffffffffffffff)) {
    dVar13.__r = std::chrono::_V2::steady_clock::now();
    expirationTime.__d.__r =
         (duration)
         ((this->rt_lag).internalTimeCode + nextTime.internalTimeCode +
         (this->start_clock_time).__d.__r);
    if (expirationTime.__d.__r == (duration)dVar13.__r ||
        (long)expirationTime.__d.__r - dVar13.__r < 0) {
      ActionMessage::ActionMessage((ActionMessage *)&local_3c8,cmd_force_time_grant);
      local_3c0 = CONCAT44(local_3c0._4_4_,(this->global_id)._M_i.gid);
      local_3a8 = nextTime.internalTimeCode;
      addAction(this,(ActionMessage *)&local_3c8);
    }
    else {
      ActionMessage::ActionMessage((ActionMessage *)&local_3c8,cmd_force_time_grant);
      local_3c0 = CONCAT44(local_3c0._4_4_,(this->global_id)._M_i.gid);
      iVar10 = this->realTimeTimerIndex;
      pMVar5 = (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (iVar10 < 0) {
        local_3a8 = nextTime.internalTimeCode;
        ActionMessage::ActionMessage(&local_e8,(ActionMessage *)&local_3c8);
        iVar10 = MessageTimer::addTimer(pMVar5,expirationTime,&local_e8);
        this->realTimeTimerIndex = iVar10;
        this_00 = &local_e8;
      }
      else {
        this_00 = &local_1a0;
        local_3a8 = nextTime.internalTimeCode;
        ActionMessage::ActionMessage(this_00,(ActionMessage *)&local_3c8);
        MessageTimer::updateTimer(pMVar5,iVar10,expirationTime,this_00);
      }
LAB_0032e09f:
      ActionMessage::~ActionMessage(this_00);
    }
    ActionMessage::~ActionMessage((ActionMessage *)&local_3c8);
  }
  else if (0 < (this->grantTimeOutPeriod).internalTimeCode) {
    ActionMessage::ActionMessage((ActionMessage *)&local_3c8,cmd_grant_timeout_check);
    local_3b8.long_long_value._4_4_ = this->mGrantCount;
    local_3b8.int128_value._8_2_ = 0;
    pMVar5 = (this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (this->grantTimeoutTimeIndex < 0) {
      lVar6 = (this->grantTimeOutPeriod).internalTimeCode;
      ActionMessage::ActionMessage(&local_258,(ActionMessage *)&local_3c8);
      iVar10 = MessageTimer::addTimerFromNow
                         (pMVar5,(nanoseconds)((lVar6 / 1000000) * 1000000),&local_258);
      this->grantTimeoutTimeIndex = iVar10;
      this_00 = &local_258;
    }
    else {
      iVar10 = this->realTimeTimerIndex;
      lVar6 = (this->grantTimeOutPeriod).internalTimeCode;
      this_00 = &local_310;
      ActionMessage::ActionMessage(this_00,(ActionMessage *)&local_3c8);
      MessageTimer::updateTimerFromNow
                (pMVar5,iVar10,(nanoseconds)((lVar6 / 1000000) * 1000000),this_00);
    }
    goto LAB_0032e09f;
  }
  result = processQueue(this);
  uVar17 = CONCAT71(extraout_var,result) & 0xffffffff;
  updateDataForTimeReturn(this,result,nextTime,iterate);
  TVar12.internalTimeCode = (this->time_granted).internalTimeCode;
  if (this->realtime == true) {
    if ((this->rt_lag).internalTimeCode != 0x7fffffffffffffff) {
      MessageTimer::cancelTimer
                ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,this->realTimeTimerIndex);
    }
    if ((char)uVar17 == '\0') {
      lVar14 = std::chrono::_V2::steady_clock::now();
      lVar14 = lVar14 - (this->start_clock_time).__d.__r;
      lVar6 = (this->time_granted).internalTimeCode;
      lVar7 = (this->rt_lead).internalTimeCode;
      if ((lVar7 < lVar6 - lVar14) && (uVar16 = lVar6 - (lVar14 + lVar7), 5000000 < (long)uVar16)) {
        local_3c8.values_ = (value<fmt::v11::context> *)(uVar16 / 1000000000);
        local_3c0 = uVar16 % 1000000000;
        do {
          iVar11 = nanosleep((timespec *)&local_3c8,(timespec *)&local_3c8);
          if (iVar11 != -1) break;
          piVar15 = __errno_location();
        } while (*piVar15 == 4);
      }
    }
  }
  else if (0 < (this->grantTimeOutPeriod).internalTimeCode) {
    MessageTimer::cancelTimer
              ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,this->grantTimeoutTimeIndex);
  }
  LOCK();
  (this->processing).super___atomic_flag_base._M_i = false;
  sVar9 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
  _Var8 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
  UNLOCK();
  if ((((TVar12.internalTimeCode != 0x7fffffffffffffff) &&
       (nextTime.internalTimeCode < TVar12.internalTimeCode)) && (lVar3 < nextTime.internalTimeCode)
      ) && (this->ignore_time_mismatch_warnings == false)) {
    local_3c8 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                ((double)(TVar12.internalTimeCode % 1000000000) * 1e-09 +
                (double)(TVar12.internalTimeCode / 1000000000));
    local_3b8.double_value =
         (double)(nextTime.internalTimeCode % 1000000000) * 1e-09 +
         (double)(nextTime.internalTimeCode / 1000000000);
    fmt.size_ = 0xaa;
    fmt.data_ = (char *)0x49;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_3c8;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)&local_3e8,
               (v11 *)"Time mismatch detected: granted time greater than requested time {} vs {}",
               fmt,args);
    logMessageSource_02._M_str = _Var8._M_p;
    logMessageSource_02._M_len = sVar9;
    message_02._M_str = (char *)local_3e8.values_;
    message_02._M_len = local_3e0;
    logMessage(this,3,logMessageSource_02,message_02,false);
    if (&(local_3e8.values_)->field_0 != &local_3d8) {
      operator_delete(local_3e8.values_,(ulong)(local_3d8.long_long_value + 1));
    }
  }
LAB_0032e2d2:
  iVar18._8_8_ = uVar17;
  iVar18.grantedTime.internalTimeCode = TVar12.internalTimeCode;
  return iVar18;
}

Assistant:

iteration_time FederateState::requestTime(Time nextTime, IterationRequest iterate, bool sendRequest)
{
    if (try_lock()) {  // only enter this loop once per federate
        const Time lastTime = timeCoord->getGrantedTime();
        events.clear();  // clear the event queue
        LOG_TRACE(timeCoord->printTimeStatus());
        // timeCoord->timeRequest (nextTime, iterate, nextValueTime (), nextMessageTime ());

        if (sendRequest) {
            ActionMessage treq(CMD_TIME_REQUEST);
            treq.source_id = global_id.load();
            treq.actionTime = nextTime;
            setIterationFlags(treq, iterate);
            setActionFlag(treq, indicator_flag);
            addAction(treq);
            LOG_TRACE(timeCoord->printTimeStatus());
        }

// timeCoord->timeRequest (nextTime, iterate, nextValueTime (), nextMessageTime ());
#ifndef HELICS_DISABLE_ASIO
        if ((realtime) && (rt_lag < Time::maxVal())) {
            auto current_clock_time = std::chrono::steady_clock::now();
            auto timegap = current_clock_time - start_clock_time;
            auto current_lead = (nextTime + rt_lag).to_ns() - timegap;
            if (current_lead > std::chrono::milliseconds(0)) {
                ActionMessage tforce(CMD_FORCE_TIME_GRANT);
                tforce.source_id = global_id.load();
                tforce.actionTime = nextTime;
                if (realTimeTimerIndex < 0) {
                    realTimeTimerIndex =
                        mTimer->addTimer(current_clock_time + current_lead, std::move(tforce));
                } else {
                    mTimer->updateTimer(realTimeTimerIndex,
                                        current_clock_time + current_lead,
                                        std::move(tforce));
                }
            } else {
                ActionMessage tforce(CMD_FORCE_TIME_GRANT);
                tforce.source_id = global_id.load();
                tforce.actionTime = nextTime;
                addAction(tforce);
            }
        } else if (grantTimeOutPeriod > timeZero) {
            ActionMessage grantCheck(CMD_GRANT_TIMEOUT_CHECK);
            grantCheck.setExtraData(static_cast<std::int32_t>(mGrantCount));
            grantCheck.counter = 0;
            if (grantTimeoutTimeIndex < 0) {
                grantTimeoutTimeIndex =
                    mTimer->addTimerFromNow(grantTimeOutPeriod.to_ms(), std::move(grantCheck));
            } else {
                mTimer->updateTimerFromNow(realTimeTimerIndex,
                                           grantTimeOutPeriod.to_ms(),
                                           std::move(grantCheck));
            }
        }
#endif
        auto ret = processQueue();
        updateDataForTimeReturn(ret, nextTime, iterate);
        iteration_time retTime = {time_granted, static_cast<IterationResult>(ret)};
#ifndef HELICS_DISABLE_ASIO
        if (realtime) {
            if (rt_lag < Time::maxVal()) {
                mTimer->cancelTimer(realTimeTimerIndex);
            }
            if (ret == MessageProcessingResult::NEXT_STEP) {
                auto current_clock_time = std::chrono::steady_clock::now();
                auto timegap = current_clock_time - start_clock_time;
                if (time_granted - Time(timegap) > rt_lead) {
                    auto current_lead = (time_granted - rt_lead).to_ns() - timegap;
                    if (current_lead > std::chrono::milliseconds(5)) {
                        std::this_thread::sleep_for(current_lead);
                    }
                }
            }
        } else if (grantTimeOutPeriod > timeZero) {
            mTimer->cancelTimer(grantTimeoutTimeIndex);
        }
#endif

        unlock();
        if (retTime.grantedTime > nextTime && nextTime > lastTime &&
            retTime.grantedTime < Time::maxVal()) {
            if (!ignore_time_mismatch_warnings) {
                LOG_WARNING(fmt::format(
                    "Time mismatch detected: granted time greater than requested time {} vs {}",
                    static_cast<double>(retTime.grantedTime),
                    static_cast<double>(nextTime)));
            }
        }
        return retTime;
    }

    // if this is not true then try again the core may have been handling something short so try
    // again
    if (!queueProcessing.load()) {
        std::this_thread::yield();
        if (!queueProcessing.load()) {
            return requestTime(nextTime, iterate, sendRequest);
        }
    }
    LOG_WARNING("duplicate locking attempted");
    // this would not be good practice to get into this part of the function
    // but the area must protect itself against the possibility and should return something sensible
    const std::lock_guard<FederateState> fedlock(*this);
    IterationResult ret = iterating ? IterationResult::ITERATING : IterationResult::NEXT_STEP;
    if (state == FederateStates::FINISHED) {
        ret = IterationResult::HALTED;
    } else if (state == FederateStates::ERRORED) {
        ret = IterationResult::ERROR_RESULT;
    }
    return {time_granted, ret};
}